

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O2

UEnumeration *
ucol_getKeywordValuesForLocale_63(char *param_1,char *locale,UBool param_3,UErrorCode *status)

{
  LocalPointerBase<UResourceBundle> bundle_00;
  UEnumeration *pUVar1;
  LocalUResourceBundlePointer bundle;
  KeywordsSink sink;
  
  bundle_00.ptr = ures_open_63("icudt63l-coll",locale,status);
  sink.super_ResourceSink.super_UObject._vptr_UObject = (UObject)&PTR__KeywordsSink_0039ac38;
  bundle.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)(LocalPointerBase<UResourceBundle>)bundle_00.ptr;
  sink.values = ulist_createEmptyList_63(status);
  sink.hasDefault = '\0';
  ures_getAllItemsWithFallback_63(bundle_00.ptr,"collations",&sink.super_ResourceSink,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar1 = (UEnumeration *)uprv_malloc_63(0x38);
    if (pUVar1 != (UEnumeration *)0x0) {
      pUVar1->reset = ulist_reset_keyword_values_iterator_63;
      pUVar1->uNext = uenum_unextDefault_63;
      pUVar1->next = ulist_next_keyword_value_63;
      pUVar1->close = ulist_close_keyword_values_iterator_63;
      pUVar1->count = ulist_count_keyword_values_63;
      pUVar1->baseContext = (void *)0x0;
      pUVar1->context = (void *)0x0;
      ulist_resetList_63(sink.values);
      pUVar1->context = sink.values;
      sink.values = (UList *)0x0;
      goto LAB_0021f7db;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  pUVar1 = (UEnumeration *)0x0;
LAB_0021f7db:
  anon_unknown.dwarf_c3ed2::KeywordsSink::~KeywordsSink(&sink);
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&bundle);
  return pUVar1;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
ucol_getKeywordValuesForLocale(const char* /*key*/, const char* locale,
                               UBool /*commonlyUsed*/, UErrorCode* status) {
    // Note: The parameter commonlyUsed is not used.
    // The switch is in the method signature for consistency
    // with other locale services.

    // Read available collation values from collation bundles.
    LocalUResourceBundlePointer bundle(ures_open(U_ICUDATA_COLL, locale, status));
    KeywordsSink sink(*status);
    ures_getAllItemsWithFallback(bundle.getAlias(), RESOURCE_NAME, sink, *status);
    if (U_FAILURE(*status)) { return NULL; }

    UEnumeration *en = (UEnumeration *)uprv_malloc(sizeof(UEnumeration));
    if (en == NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    memcpy(en, &defaultKeywordValues, sizeof(UEnumeration));
    ulist_resetList(sink.values);  // Initialize the iterator.
    en->context = sink.values;
    sink.values = NULL;  // Avoid deletion in the sink destructor.
    return en;
}